

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O3

void __thiscall AgenPeeps::PeepFunc(AgenPeeps *this)

{
  IRKind IVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *pFVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  Instr *pIVar12;
  uint uVar13;
  Instr *this_00;
  
  bVar4 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
  if (bVar4) {
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,AtomPhase,uVar5,uVar6);
    if (bVar4) {
      return;
    }
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
    pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,AgenPeepsPhase,uVar5,uVar6);
    if (bVar4) {
      return;
    }
  }
  else {
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,AtomPhase,uVar5,uVar6);
    if (!bVar4) {
      pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar5 = JITTimeFunctionBody::GetSourceContextId(pJVar8);
      pFVar9 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar6 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar9);
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,AgenPeepsPhase,uVar5,uVar6);
      if (!bVar4) {
        return;
      }
    }
  }
  this_00 = this->func->m_headInstr;
  if (this_00 != (Instr *)0x0) {
    iVar7 = 0;
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    pIVar11 = (Instr *)0x0;
    do {
      pIVar2 = this_00->m_next;
      bVar4 = IR::Instr::IsRealInstr(this_00);
      IVar1 = this_00->m_kind;
      uVar13 = (uint)IVar1;
      if (bVar4) {
        if ((IVar1 != InstrKindBranch) && (IVar1 != InstrKindExit)) {
LAB_0064ce7b:
          if (((2 < this_00->m_opcode - 0x23) && (1 < this_00->m_opcode - 0x173)) &&
             ((6 < uVar13 || ((0x68U >> (uVar13 & 0x1f) & 1) == 0)))) {
            pIVar12 = IR::Instr::GetNextRealInstrOrLabel(this_00);
            IVar1 = pIVar12->m_kind;
            if (((((IVar1 == InstrKindBranch) || (IVar1 == InstrKindExit)) ||
                 (pIVar12->m_opcode - 0x23 < 3)) ||
                ((pIVar12->m_opcode - 0x173 < 2 ||
                 ((IVar1 < 7 && ((0x68U >> (IVar1 & 0x1f) & 1) != 0)))))) ||
               (bVar4 = AgenDependentInstrs(this,this_00,pIVar12), !bVar4)) {
              iVar7 = 0;
            }
            else {
              pIVar12 = pIVar11;
              if (pIVar11 == (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar10 = 1;
                bVar4 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                                   ,0x3e,"(blockStart)","blockStart");
                if (!bVar4) {
                  pcVar3 = (code *)invalidInstructionException();
                  (*pcVar3)();
                }
                *puVar10 = 0;
                pIVar12 = (Instr *)0x0;
              }
              iVar7 = MoveInstrUp(this,this_00,pIVar12,iVar7);
              iVar7 = iVar7 + -3;
            }
            goto LAB_0064ceb2;
          }
        }
        pIVar11 = IR::Instr::GetNextRealInstr(this_00);
        iVar7 = 0;
        pIVar2 = pIVar11;
      }
      else if ((uVar13 == 3) || (uVar13 == 5)) goto LAB_0064ce7b;
LAB_0064ceb2:
      this_00 = pIVar2;
    } while (this_00 != (Instr *)0x0);
  }
  return;
}

Assistant:

void AgenPeeps::PeepFunc()
{
    int distance = 0;
    IR::Instr *blockStart, *nextRealInstr;
    const uint stall_cycles = 3;

    if (AutoSystemInfo::Data.IsAtomPlatform())
    {
        // On Atom, always optimize unless phase is off
        if (PHASE_OFF(Js::AtomPhase, func) || PHASE_OFF(Js::AgenPeepsPhase, func))
            return;
    }
    else
    {
        // On other platforms, don't optimize unless phase is forced
        if (!PHASE_FORCE(Js::AtomPhase, func) && !PHASE_FORCE(Js::AgenPeepsPhase, func))
            return;
    }

    blockStart = nullptr;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr() && !instr->IsLabelInstr())
            continue;

        // BB boundary ?
        if (instr->EndsBasicBlock() || instr->StartsBasicBlock())
        {
            distance = 0;
            instrNext = blockStart = instr->GetNextRealInstr();
            continue;
        }
        nextRealInstr = instr->GetNextRealInstrOrLabel();
        // Check for AGEN dependency with the next instruction in the same BB
        if (!nextRealInstr->EndsBasicBlock() && !nextRealInstr->StartsBasicBlock() &&
            AgenDependentInstrs(instr, nextRealInstr))
        {
            Assert(blockStart);
            // Move instr up
            distance = MoveInstrUp(instr, blockStart, distance) - stall_cycles;
        } else
            distance = 0;

    } NEXT_INSTR_IN_FUNC_EDITING;
}